

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

ull bf_(int s,int l,ull *a,ull *m)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  ull m1;
  ull m0;
  ull res;
  int bit;
  int idx;
  ull *m_local;
  ull *a_local;
  int l_local;
  int s_local;
  
  iVar1 = s / 0x40;
  bVar3 = (byte)(s % 0x40);
  uVar2 = (1L << ((byte)l & 0x3f)) + -1 << (bVar3 & 0x3f);
  m[iVar1] = uVar2 | m[iVar1];
  m0 = (a[iVar1] & uVar2) >> (bVar3 & 0x3f);
  if (0x40 < s % 0x40 + l) {
    uVar2 = (1L << ((byte)l & 0x3f)) - 1U >> (0x40 - bVar3 & 0x3f);
    m[iVar1 + 1] = uVar2 | m[iVar1 + 1];
    m0 = (a[iVar1 + 1] & uVar2) << (0x40 - bVar3 & 0x3f) | m0;
  }
  return m0;
}

Assistant:

static inline ull bf_(int s, int l, ull *a, ull *m) {
	int idx = s / 0x40;
	int bit = s % 0x40;
	ull res = 0;
	ull m0 = (((1ull << l) - 1) << bit);
	m[idx] |= m0;
	res |= (a[idx] & m0) >> bit;
	if (bit + l > 0x40) {
		ull m1 = (((1ull << l) - 1) >> (0x40 - bit));
		m[idx+1] |= m1;
		res |= (a[idx+1] & m1) << (0x40 - bit);
	}
	return res;
}